

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O3

void testLutHeader(void)

{
  pointer ppLVar1;
  pointer ppLVar2;
  char cVar3;
  uint uVar4;
  LutHeaderWorker *pLVar5;
  Thread *this;
  ulong uVar6;
  undefined8 *__dest;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  value_type *__x;
  undefined8 *puVar10;
  pointer ppLVar11;
  long lVar12;
  undefined8 *puVar13;
  ulong uVar14;
  long lVar15;
  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  workers;
  undefined8 *local_70;
  LutHeaderWorker *local_60;
  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  local_58;
  undefined8 *local_40;
  pointer local_38;
  
  local_58.
  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 1;
  cVar3 = IlmThread_3_2::supportsThreads();
  if (cVar3 != '\0') {
    uVar4 = std::thread::hardware_concurrency();
    uVar9 = 1;
    if (1 < (int)uVar4) {
      uVar9 = (ulong)uVar4;
    }
  }
  uVar6 = 0;
  uVar8 = 0x10000 / uVar9;
  do {
    if (uVar6 == uVar9 - 1) {
      pLVar5 = (LutHeaderWorker *)operator_new(0x30);
      anon_unknown.dwarf_14ca2a::LutHeaderWorker::LutHeaderWorker
                (pLVar5,(uVar9 - 1) * uVar8,0x10000);
      __x = &local_60;
      local_60 = pLVar5;
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::push_back(&local_58,__x);
    }
    else {
      pLVar5 = (LutHeaderWorker *)operator_new(0x30);
      anon_unknown.dwarf_14ca2a::LutHeaderWorker::LutHeaderWorker
                (pLVar5,uVar6 * uVar8,(uVar6 + 1) * uVar8);
      __x = &local_60;
      local_60 = pLVar5;
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::push_back(&local_58,__x);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != uVar9);
  cVar3 = IlmThread_3_2::supportsThreads();
  ppLVar2 = local_58.
            super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppLVar1 = local_58.
            super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar11 = local_58.
             super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (cVar3 == '\0') {
    if ((long)local_58.
              super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_58.
              super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar12 = (long)local_58.
                     super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_58.
                     super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar15 = 0;
      do {
        anon_unknown.dwarf_14ca2a::LutHeaderWorker::run(ppLVar1[lVar15],SUB81(__x,0));
        lVar15 = lVar15 + 1;
        ppLVar11 = ppLVar2;
      } while (lVar12 + (ulong)(lVar12 == 0) != lVar15);
    }
  }
  else if (local_58.
           super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_58.
           super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
           ._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    local_70 = (undefined8 *)0x0;
    puVar13 = (undefined8 *)0x0;
    puVar10 = (undefined8 *)0x0;
    ppLVar11 = local_58.
               super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      local_40 = puVar13;
      local_38 = ppLVar11;
      this = (Thread *)operator_new(0x48);
      pLVar5 = ppLVar1[uVar9];
      IlmThread_3_2::Thread::Thread(this);
      puVar13 = local_40;
      *(undefined ***)this = &PTR__Runner_001ed198;
      *(LutHeaderWorker **)(this + 0x10) = pLVar5;
      this[0x18] = (Thread)(uVar9 == 0);
      IlmThread_3_2::Semaphore::Semaphore((Semaphore *)(this + 0x20),0);
      IlmThread_3_2::Thread::start();
      if (puVar10 == puVar13) {
        uVar8 = (long)puVar13 - (long)local_70;
        if (uVar8 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar7 = (long)uVar8 >> 3;
        uVar6 = 1;
        if (puVar13 != local_70) {
          uVar6 = uVar7;
        }
        uVar14 = uVar6 + uVar7;
        if (0xffffffffffffffe < uVar14) {
          uVar14 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar6,uVar7)) {
          uVar14 = 0xfffffffffffffff;
        }
        if (uVar14 == 0) {
          __dest = (undefined8 *)0x0;
        }
        else {
          __dest = (undefined8 *)operator_new(uVar14 * 8);
        }
        __dest[uVar7] = this;
        if (0 < (long)uVar8) {
          memmove(__dest,local_70,uVar8);
        }
        if (local_70 != (undefined8 *)0x0) {
          operator_delete(local_70,uVar8);
        }
        puVar10 = (undefined8 *)(uVar8 + (long)__dest);
        puVar13 = __dest + uVar14;
        ppLVar11 = local_38;
        local_70 = __dest;
      }
      else {
        *puVar10 = this;
        ppLVar11 = local_58.
                   super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      puVar10 = puVar10 + 1;
      uVar9 = uVar9 + 1;
      uVar8 = (long)ppLVar11 - (long)ppLVar1 >> 3;
    } while (uVar9 < uVar8);
    if (ppLVar11 == ppLVar1) {
      if (local_70 == (undefined8 *)0x0) goto LAB_00162f25;
    }
    else {
      uVar9 = 0;
      do {
        if ((long *)local_70[uVar9] != (long *)0x0) {
          (**(code **)(*(long *)local_70[uVar9] + 8))();
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    operator_delete(local_70,(long)puVar13 - (long)local_70);
  }
LAB_00162f25:
  puts("test closestDataOffset[]");
  puts("test closestData[]");
  if ((long)ppLVar11 - (long)ppLVar1 == 0) {
    if (ppLVar1 == (pointer)0x0) {
      return;
    }
  }
  else {
    lVar12 = (long)ppLVar11 - (long)ppLVar1 >> 3;
    lVar15 = 0;
    do {
      pLVar5 = ppLVar1[lVar15];
      if (pLVar5 != (LutHeaderWorker *)0x0) {
        if (pLVar5->_offset != (size_t *)0x0) {
          operator_delete__(pLVar5->_offset);
        }
        if (pLVar5->_elements != (unsigned_short *)0x0) {
          operator_delete__(pLVar5->_elements);
        }
      }
      operator_delete(pLVar5,0x30);
      lVar15 = lVar15 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar15);
  }
  operator_delete(ppLVar1,(long)local_58.
                                super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar1);
  return;
}

Assistant:

const size_t* offset () const { return _offset; }